

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinExport::WriteBinaryBone(AssbinExport *this,IOStream *container,aiBone *b)

{
  uint uVar1;
  uint i;
  uint32_t t;
  uint32_t t_1;
  AssbinChunkWriter chunk;
  uint local_a8 [6];
  aiBone *local_90;
  AssbinExport *local_88;
  float *local_80;
  float *local_78;
  float *local_70;
  AssbinChunkWriter local_68;
  
  local_68.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_00995890;
  local_68.buffer = (uint8_t *)0x0;
  local_68.magic = 0x123a;
  local_68.cur_size = 0;
  local_68.cursor = 0;
  local_68.initial = 0x1000;
  uVar1 = (b->mName).length;
  local_88 = this;
  local_68.container = container;
  AssbinChunkWriter::Grow(&local_68,4);
  *(ai_uint32 *)(local_68.buffer + local_68.cursor) = (b->mName).length;
  local_68.cursor = local_68.cursor + 4;
  (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,(b->mName).data,(ulong)uVar1,1);
  local_a8[0] = b->mNumWeights;
  (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,local_a8,4,1);
  local_70 = &(b->mOffsetMatrix).d1;
  local_78 = &(b->mOffsetMatrix).c1;
  local_80 = &(b->mOffsetMatrix).b1;
  local_90 = b;
  (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&b->mOffsetMatrix,4);
  (*(code *)&LAB_0064ef18)();
  return;
}

Assistant:

void WriteBinaryBone(IOStream * container, const aiBone* b)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AIBONE );

        Write<aiString>(&chunk,b->mName);
        Write<unsigned int>(&chunk,b->mNumWeights);
        Write<aiMatrix4x4>(&chunk,b->mOffsetMatrix);

        // for the moment we write dumb min/max values for the bones, too.
        // maybe I'll add a better, hash-like solution later
        if (shortened) {
            WriteBounds(&chunk,b->mWeights,b->mNumWeights);
        } // else write as usual
        else WriteArray<aiVertexWeight>(&chunk,b->mWeights,b->mNumWeights);
    }